

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilePS.cpp
# Opt level: O3

void __thiscall
chrono::ChFile_ps::ClipRectangle
          (ChFile_ps *this,ChVector2<double> *mfrom,ChVector2<double> *mwh,Space space)

{
  ChStreamOutAscii *this_00;
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  ChVector2<double> local_a8;
  ChVector2<double> local_98;
  ChVector2<double> local_88;
  ChVector2<double> local_70;
  ChVector2<double> local_60;
  ChVector2<double> local_50;
  ChVector2<double> local_40;
  ChVector2<double> local_30;
  
  dVar1 = mfrom->m_data[0];
  dVar2 = mwh->m_data[0];
  this_00 = &(this->super_ChStreamOutAsciiFile).super_ChStreamOutAscii;
  dVar4 = dVar1 + dVar2;
  dVar5 = mfrom->m_data[1] + mwh->m_data[1];
  ChStreamOutAscii::operator<<(this_00,"NP\n");
  local_88.m_data[0] = mfrom->m_data[0];
  local_88.m_data[1] = mfrom->m_data[1];
  TransPt(this,&local_88,space);
  MoveTo(this,&local_30);
  local_50.m_data[0] = dVar1 + dVar2;
  local_50.m_data[1] = 0.0;
  TransPt(this,&local_50,space);
  AddLinePoint(this,&local_40);
  local_98.m_data[0] = dVar4;
  local_98.m_data[1] = dVar5;
  TransPt(this,&local_98,space);
  AddLinePoint(this,&local_60);
  auVar3._8_8_ = dVar5;
  auVar3._0_8_ = dVar4;
  local_a8.m_data = (double  [2])vmovlps_avx(auVar3,dVar1);
  TransPt(this,&local_a8,space);
  AddLinePoint(this,&local_70);
  ChStreamOutAscii::operator<<(this_00,"CP\n");
  ChStreamOutAscii::operator<<(this_00,"CL\n");
  return;
}

Assistant:

void ChFile_ps::ClipRectangle(ChVector2<> mfrom, ChVector2<> mwh, Space space) {
    ChVector2<> mp1, mp2, mp3;
    mp1.x() = mfrom.x() + mwh.x();
    mp1.y() = mfrom.y();
    mp2.x() = mfrom.x() + mwh.x();
    mp2.y() = mfrom.y() + mwh.y();
    mp3.x() = mfrom.x();
    mp3.y() = mfrom.y() + mwh.y();
    StartLine();
    MoveTo(TransPt(mfrom, space));
    AddLinePoint(TransPt(mp1, space));
    AddLinePoint(TransPt(mp2, space));
    AddLinePoint(TransPt(mp3, space));
    CloseLine();
    Clip();
}